

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

void jpeg_set_marker_processor
               (j_decompress_ptr cinfo,int marker_code,jpeg_marker_parser_method routine)

{
  undefined8 in_RDX;
  int in_ESI;
  long *in_RDI;
  my_marker_ptr_conflict marker;
  
  if (in_ESI == 0xfe) {
    *(undefined8 *)(in_RDI[0x49] + 0x28) = in_RDX;
  }
  else if ((in_ESI < 0xe0) || (0xef < in_ESI)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x44;
    *(int *)(*in_RDI + 0x2c) = in_ESI;
    (**(code **)*in_RDI)(in_RDI);
  }
  else {
    *(undefined8 *)(in_RDI[0x49] + 0x30 + (long)(in_ESI + -0xe0) * 8) = in_RDX;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_set_marker_processor(j_decompress_ptr cinfo, int marker_code,
                          jpeg_marker_parser_method routine)
{
  my_marker_ptr marker = (my_marker_ptr)cinfo->marker;

  if (marker_code == (int)M_COM)
    marker->process_COM = routine;
  else if (marker_code >= (int)M_APP0 && marker_code <= (int)M_APP15)
    marker->process_APPn[marker_code - (int)M_APP0] = routine;
  else
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, marker_code);
}